

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexStats.cpp
# Opt level: O1

Ticks UnifiedRegex::RegexStatsDatabase::Now(void)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  LARGE_INTEGER in_RAX;
  undefined4 *puVar4;
  LARGE_INTEGER local_18;
  LARGE_INTEGER tmp;
  
  local_18 = in_RAX;
  BVar3 = QueryPerformanceCounter(&local_18);
  if (BVar3 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexStats.cpp"
                       ,0x8d,"(false)","false");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
    local_18.QuadPart = 0;
  }
  return local_18.QuadPart;
}

Assistant:

RegexStats::Ticks RegexStatsDatabase::Now()
    {
        LARGE_INTEGER tmp;
        if (QueryPerformanceCounter(&tmp))
            return tmp.QuadPart;
        else
        {
            Assert(false);
            return 0;
        }
    }